

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x11_window.c
# Opt level: O0

void disableRawMouseMotion(_GLFWwindow *window)

{
  undefined1 local_21;
  undefined1 local_20 [7];
  uchar mask [1];
  XIEventMask em;
  _GLFWwindow *window_local;
  
  memset(&local_21,0,1);
  local_20._0_4_ = 1;
  stack0xffffffffffffffe4 = 1;
  (*_glfw.x11.xi.SelectEvents)(_glfw.x11.display,_glfw.x11.root,(XIEventMask *)local_20,1);
  return;
}

Assistant:

static void disableRawMouseMotion(_GLFWwindow* window)
{
    XIEventMask em;
    unsigned char mask[] = { 0 };

    em.deviceid = XIAllMasterDevices;
    em.mask_len = sizeof(mask);
    em.mask = mask;

    XISelectEvents(_glfw.x11.display, _glfw.x11.root, &em, 1);
}